

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O2

bool __thiscall
deqp::RobustBufferAccessBehavior::TexelFetchTest::verifyValidResults
          (TexelFetchTest *this,GLuint texture_id)

{
  pointer puVar1;
  ostringstream *poVar2;
  uchar uVar3;
  uchar uVar4;
  GLuint i;
  int iVar5;
  GLenum GVar6;
  undefined4 extraout_var;
  long lVar7;
  float *pfVar8;
  uchar uVar9;
  ulong uVar10;
  bool bVar11;
  float fVar12;
  allocator<char> local_2f6;
  allocator<char> local_2f5;
  allocator<char> local_2f4;
  allocator<char> local_2f3;
  allocator<char> local_2f2;
  allocator<char> local_2f1;
  float local_2f0;
  float local_2ec;
  float local_2e8;
  float local_2e4;
  float local_2e0;
  float local_2dc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  Texture destination_texture;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pixels_2;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [384];
  Functions *gl;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar5);
  switch(this->m_test_case) {
  case R8:
    RobustBufferAccessBehavior::Texture::Bind(gl,texture_id,0xde1);
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&pixels,0x100);
    for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
      pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7] = (uchar)lVar7;
    }
    RobustBufferAccessBehavior::Texture::GetData
              (gl,0,0xde1,0x1903,0x1401,
               pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    RobustBufferAccessBehavior::Texture::Bind(gl,0,0xde1);
    uVar10 = 0xffffffffffffffff;
    do {
      if (uVar10 == 0xff) {
        bVar11 = true;
        goto LAB_00d57df2;
      }
      lVar7 = uVar10 + 1;
      uVar10 = uVar10 + 1;
    } while (uVar10 == pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar7]);
    bVar11 = 0xff < uVar10;
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar2 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"Invalid value: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<((ostream *)poVar2,". Expected value: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<((ostream *)poVar2," at offset: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
LAB_00d57df2:
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    break;
  case RG8_SNORM:
    RobustBufferAccessBehavior::Texture::Bind(gl,texture_id,0xde1);
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<signed_char,_std::allocator<signed_char>_>::resize
              ((vector<signed_char,_std::allocator<signed_char>_> *)&pixels,0x200);
    for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
      pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7 * 2] = (uchar)lVar7;
      pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7 * 2 + 1] = (uchar)lVar7;
    }
    RobustBufferAccessBehavior::Texture::GetData
              (gl,0,0xde1,0x8227,0x1400,
               pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    RobustBufferAccessBehavior::Texture::Bind(gl,0,0xde1);
    for (uVar10 = 0; uVar10 != 0x100; uVar10 = uVar10 + 1) {
      iVar5 = ((uint)uVar10 & 0xf) - 8;
      uVar9 = (char)(uVar10 >> 4) + 0xf8;
      uVar3 = pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar10 * 2];
      uVar4 = pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar10 * 2 + 1];
      if ((iVar5 != (char)uVar3) || (uVar9 != uVar4)) {
        bVar11 = 0xff < uVar10;
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar2 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,"Invalid value: ");
        std::ostream::operator<<(poVar2,(int)(char)uVar3);
        std::operator<<((ostream *)poVar2,", ");
        std::ostream::operator<<(poVar2,(int)(char)uVar4);
        std::operator<<((ostream *)poVar2,". Expected value: ");
        std::ostream::operator<<(poVar2,iVar5);
        std::operator<<((ostream *)poVar2,", ");
        std::ostream::operator<<(poVar2,(int)(char)uVar9);
        std::operator<<((ostream *)poVar2,". At offset: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        goto LAB_00d57f05;
      }
    }
    bVar11 = true;
LAB_00d57f05:
    std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
              ((_Vector_base<signed_char,_std::allocator<signed_char>_> *)&pixels);
    break;
  case R32UI_MULTISAMPLE:
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(this->super_TestCase).m_context;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish._4_4_ << 0x20);
    destination_texture.m_id = 0xffffffff;
    destination_texture.m_context =
         (Context *)
         pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    RobustBufferAccessBehavior::Texture::Generate(gl,&destination_texture.m_id);
    RobustBufferAccessBehavior::Texture::Bind(gl,destination_texture.m_id,0xde1);
    RobustBufferAccessBehavior::Texture::Storage(gl,0xde1,1,0x8236,0x10,0x10,0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,
               "#version 430 core\n\nlayout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n\nlayout (location = 1)        writeonly uniform uimage2D   uni_destination_image;\nlayout (location = 0, r32ui) readonly  uniform uimage2DMS uni_source_image;\n\nvoid main()\n{\n    const ivec2 point = ivec2(gl_WorkGroupID.x, gl_WorkGroupID.y);\n    const uint  index = gl_WorkGroupID.y * 16 + gl_WorkGroupID.x;\n\n    const uvec4 color_0 = imageLoad(uni_source_image, point, 0);\n    const uvec4 color_1 = imageLoad(uni_source_image, point, 1);\n    const uvec4 color_2 = imageLoad(uni_source_image, point, 2);\n    const uvec4 color_3 = imageLoad(uni_source_image, point, 3);\n\n    if (any(equal(uvec4(color_0.r, color_1.r, color_2.r, color_3.r), uvec4(index + 3))))\n    {\n        imageStore(uni_destination_image, point, uvec4(1, 1, 1, 1));\n    }\n    else\n    {\n        imageStore(uni_destination_image, point, uvec4(0, 0, 0, 0));\n    }\n}\n\n"
               ,&local_2f1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pixels_2,glcts::fixed_sample_locations_values + 1,&local_2f2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,glcts::fixed_sample_locations_values + 1,&local_2f3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,glcts::fixed_sample_locations_values + 1,&local_2f4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,glcts::fixed_sample_locations_values + 1,&local_2f5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,glcts::fixed_sample_locations_values + 1,&local_2f6);
    RobustBufferAccessBehavior::Program::Init
              ((Program *)&pixels,(string *)local_1b0,(string *)&pixels_2,&local_1f0,&local_210,
               &local_230,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&pixels_2);
    std::__cxx11::string::~string((string *)local_1b0);
    RobustBufferAccessBehavior::Program::Use((Program *)&pixels);
    (*gl->bindImageTexture)(0,texture_id,0,'\0',0,35000,0x8236);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"BindImageTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x916);
    (*gl->bindImageTexture)(1,destination_texture.m_id,0,'\0',0,0x88b9,0x8236);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"BindImageTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x919);
    (*gl->uniform1i)(0,0);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"Uniform1i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x91c);
    (*gl->uniform1i)(1,1);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"Uniform1i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x91f);
    (*gl->dispatchCompute)(0x10,0x10,1);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"DispatchCompute",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x922);
    pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&pixels_2,0x100);
    for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
      pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7] = (uint)lVar7;
    }
    RobustBufferAccessBehavior::Texture::GetData
              (gl,0,0xde1,0x8d94,0x1405,
               pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
    RobustBufferAccessBehavior::Texture::Bind(gl,0,0xde1);
    uVar10 = 0xffffffffffffffff;
    do {
      if (uVar10 == 0xff) {
        bVar11 = true;
        goto LAB_00d57e0c;
      }
      lVar7 = uVar10 + 1;
      uVar10 = uVar10 + 1;
    } while (pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar7] == 1);
    bVar11 = 0xff < uVar10;
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar2 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"Invalid value: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<((ostream *)poVar2,". Expected value: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<((ostream *)poVar2," at offset: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
LAB_00d57e0c:
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    RobustBufferAccessBehavior::Texture::~Texture(&destination_texture);
    RobustBufferAccessBehavior::Program::~Program((Program *)&pixels);
    break;
  case RGBA32F:
    RobustBufferAccessBehavior::Texture::Bind(gl,texture_id,0xde1);
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)&pixels,0x400);
    pfVar8 = (float *)pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
    for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
      fVar12 = (float)(int)lVar7 * 0.00390625;
      *pfVar8 = fVar12;
      pfVar8[1] = fVar12;
      pfVar8[2] = fVar12;
      pfVar8[3] = fVar12;
      pfVar8 = pfVar8 + 4;
    }
    RobustBufferAccessBehavior::Texture::GetData
              (gl,0,0xde1,0x1908,0x1406,
               pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    RobustBufferAccessBehavior::Texture::Bind(gl,0,0xde1);
    pfVar8 = (float *)(pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + 0xc);
    for (uVar10 = 0; uVar10 != 0x100; uVar10 = uVar10 + 1) {
      local_2e0 = (float)((uint)uVar10 & 0xf) * 0.0625;
      local_2e4 = (float)((uint)(uVar10 >> 4) & 0xfffffff) * 0.0625;
      local_2ec = (float)(int)(uint)uVar10 * 0.00390625;
      local_2dc = pfVar8[-3];
      fVar12 = pfVar8[-2];
      local_2e8 = pfVar8[-1];
      local_2f0 = *pfVar8;
      if (((((local_2e0 != local_2dc) || (NAN(local_2e0) || NAN(local_2dc))) ||
           (local_2e4 != fVar12)) || ((NAN(local_2e4) || NAN(fVar12) || (local_2ec != local_2e8))))
         || ((NAN(local_2ec) || NAN(local_2e8) || ((local_2f0 != 1.0 || (NAN(local_2f0))))))) {
        bVar11 = 0xff < uVar10;
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar2 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,"Invalid value: ");
        std::ostream::operator<<(poVar2,local_2dc);
        std::operator<<((ostream *)poVar2,", ");
        std::ostream::operator<<(poVar2,fVar12);
        std::operator<<((ostream *)poVar2,", ");
        std::ostream::operator<<(poVar2,local_2e8);
        std::operator<<((ostream *)poVar2,", ");
        std::ostream::operator<<(poVar2,local_2f0);
        std::operator<<((ostream *)poVar2,". Expected value: ");
        std::ostream::operator<<(poVar2,local_2e0);
        std::operator<<((ostream *)poVar2,", ");
        std::ostream::operator<<(poVar2,local_2e4);
        std::operator<<((ostream *)poVar2,", ");
        std::ostream::operator<<(poVar2,local_2ec);
        std::operator<<((ostream *)poVar2,", ");
        std::ostream::operator<<(poVar2,1.0);
        std::operator<<((ostream *)poVar2,". At offset: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        goto LAB_00d57f14;
      }
      pfVar8 = pfVar8 + 4;
    }
    bVar11 = true;
LAB_00d57f14:
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&pixels);
    break;
  case R32UI_MIPMAP:
    RobustBufferAccessBehavior::Texture::Bind(gl,texture_id,0xde1);
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pixels,0x400);
    for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
      puVar1 = pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + lVar7 * 4;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
    }
    RobustBufferAccessBehavior::Texture::GetData
              (gl,1,0xde1,0x8d94,0x1405,
               pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    RobustBufferAccessBehavior::Texture::Bind(gl,0,0xde1);
    uVar10 = 0xffffffffffffffff;
    do {
      if (uVar10 == 0xff) {
        bVar11 = true;
        goto LAB_00d57de0;
      }
      lVar7 = uVar10 * 4;
      uVar10 = uVar10 + 1;
    } while (uVar10 == *(uint *)(pixels.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar7 + 4));
    bVar11 = 0xff < uVar10;
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar2 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"Invalid value: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<((ostream *)poVar2,". Expected value: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<((ostream *)poVar2," at offset: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
LAB_00d57de0:
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&pixels);
    break;
  default:
    bVar11 = true;
  }
  return bVar11;
}

Assistant:

bool TexelFetchTest::verifyValidResults(glw::GLuint texture_id)
{
	static const GLuint height   = 16;
	static const GLuint width	= 16;
	static const GLuint n_pixels = height * width;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool result = true;

	if (R8 == m_test_case)
	{
		static const GLuint n_channels = 1;

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		std::vector<GLubyte> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i] = static_cast<GLubyte>(i);
		}

		Texture::GetData(gl, 0 /* level */, GL_TEXTURE_2D, GL_RED, GL_UNSIGNED_BYTE, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLubyte expected_red = static_cast<GLubyte>(i);
			const GLubyte drawn_red	= pixels[i];

			if (expected_red != drawn_red)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid value: " << (GLuint)drawn_red
													<< ". Expected value: " << (GLuint)expected_red
													<< " at offset: " << i << tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (RG8_SNORM == m_test_case)
	{
		static const GLuint n_channels = 2;

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		std::vector<GLbyte> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i * n_channels + 0] = static_cast<GLubyte>(i);
			pixels[i * n_channels + 1] = static_cast<GLubyte>(i);
		}

		Texture::GetData(gl, 0 /* level */, GL_TEXTURE_2D, GL_RG, GL_BYTE, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLbyte expected_red   = static_cast<GLubyte>((i % 16) - 8);
			const GLbyte expected_green = static_cast<GLubyte>((i / 16) - 8);
			const GLbyte drawn_red		= pixels[i * n_channels + 0];
			const GLbyte drawn_green	= pixels[i * n_channels + 1];

			if ((expected_red != drawn_red) || (expected_green != drawn_green))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Invalid value: " << (GLint)drawn_red << ", " << (GLint)drawn_green
					<< ". Expected value: " << (GLint)expected_red << ", " << (GLint)expected_green
					<< ". At offset: " << i << tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (RGBA32F == m_test_case)
	{
		static const GLuint n_channels = 4;

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		std::vector<GLfloat> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i * n_channels + 0] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 1] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 2] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 3] = (GLfloat)i / (GLfloat)n_pixels;
		}

		Texture::GetData(gl, 0 /* level */, GL_TEXTURE_2D, GL_RGBA, GL_FLOAT, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLfloat expected_red   = (GLfloat)(i % 16) / 16.0f;
			const GLfloat expected_green = (GLfloat)(i / 16) / 16.0f;
			const GLfloat expected_blue  = (GLfloat)i / 256.0f;
			const GLfloat expected_alpha = 1.0f;
			const GLfloat drawn_red		 = pixels[i * n_channels + 0];
			const GLfloat drawn_green	= pixels[i * n_channels + 1];
			const GLfloat drawn_blue	 = pixels[i * n_channels + 2];
			const GLfloat drawn_alpha	= pixels[i * n_channels + 3];

			if ((expected_red != drawn_red) || (expected_green != drawn_green) || (expected_blue != drawn_blue) ||
				(expected_alpha != drawn_alpha))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Invalid value: " << drawn_red << ", " << drawn_green << ", "
					<< drawn_blue << ", " << drawn_alpha << ". Expected value: " << expected_red << ", "
					<< expected_green << ", " << expected_blue << ", " << expected_alpha << ". At offset: " << i
					<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (R32UI_MIPMAP == m_test_case)
	{
		static const GLuint n_channels = 1;

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		std::vector<GLuint> pixels;
		pixels.resize(n_pixels * n_channels * 4);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i] = 0;
		}

		Texture::GetData(gl, 1 /* level */, GL_TEXTURE_2D, GL_RED_INTEGER, GL_UNSIGNED_INT, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLuint expected_red = i;
			const GLuint drawn_red	= pixels[i];

			if (expected_red != drawn_red)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid value: " << drawn_red
													<< ". Expected value: " << expected_red << " at offset: " << i
													<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (R32UI_MULTISAMPLE == m_test_case)
	{
		static const GLuint n_channels = 1;

		/* Compute shader */
		static const GLchar* cs =
			"#version 430 core\n"
			"\n"
			"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
			"\n"
			"layout (location = 1)        writeonly uniform uimage2D   uni_destination_image;\n"
			"layout (location = 0, r32ui) readonly  uniform uimage2DMS uni_source_image;\n"
			"\n"
			"void main()\n"
			"{\n"
			"    const ivec2 point = ivec2(gl_WorkGroupID.x, gl_WorkGroupID.y);\n"
			"    const uint  index = gl_WorkGroupID.y * 16 + gl_WorkGroupID.x;\n"
			"\n"
			"    const uvec4 color_0 = imageLoad(uni_source_image, point, 0);\n"
			"    const uvec4 color_1 = imageLoad(uni_source_image, point, 1);\n"
			"    const uvec4 color_2 = imageLoad(uni_source_image, point, 2);\n"
			"    const uvec4 color_3 = imageLoad(uni_source_image, point, 3);\n"
			"\n"
			"    if (any(equal(uvec4(color_0.r, color_1.r, color_2.r, color_3.r), uvec4(index + 3))))\n"
			"    {\n"
			"        imageStore(uni_destination_image, point, uvec4(1, 1, 1, 1));\n"
			"    }\n"
			"    else\n"
			"    {\n"
			"        imageStore(uni_destination_image, point, uvec4(0, 0, 0, 0));\n"
			"    }\n"
			"}\n"
			"\n";

		Program program(m_context);
		Texture destination_texture(m_context);

		Texture::Generate(gl, destination_texture.m_id);
		Texture::Bind(gl, destination_texture.m_id, GL_TEXTURE_2D);
		Texture::Storage(gl, GL_TEXTURE_2D, 1, GL_R32UI, width, height, 0 /* depth */);

		program.Init(cs, "", "", "", "", "");
		program.Use();
		gl.bindImageTexture(0 /* unit */, texture_id, 0 /* level */, GL_FALSE /* layered */, 0 /* layer */,
							GL_READ_ONLY, GL_R32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTexture");
		gl.bindImageTexture(1 /* unit */, destination_texture.m_id, 0 /* level */, GL_FALSE /* layered */,
							0 /* layer */, GL_WRITE_ONLY, GL_R32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTexture");

		gl.uniform1i(0 /* location */, 0 /* image unit*/);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");

		gl.uniform1i(1 /* location */, 1 /* image unit*/);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");

		gl.dispatchCompute(16, 16, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute");

		/* Pixels buffer initialization */
		std::vector<GLuint> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i] = i;
		}

		Texture::GetData(gl, 0 /* level */, GL_TEXTURE_2D, GL_RED_INTEGER, GL_UNSIGNED_INT, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLuint expected_red = 1;
			const GLuint drawn_red	= pixels[i];

			if (expected_red != drawn_red)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid value: " << drawn_red
													<< ". Expected value: " << expected_red << " at offset: " << i
													<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}

	return result;
}